

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexVerifierUtil.cpp
# Opt level: O1

void tcu::TexVerifierUtil::getPossibleCubeFaces
               (Vec3 *coord,IVec3 *bits,CubeFace *faces,int *numFaces)

{
  float fVar1;
  float fVar2;
  float fVar3;
  byte bVar4;
  byte bVar5;
  int iVar6;
  float fVar7;
  int iVar8;
  CubeFace CVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  deUint32 u32_2;
  float fVar13;
  deUint32 u32_1;
  float fVar14;
  deUint32 u32;
  float fVar15;
  
  fVar1 = coord->m_data[0];
  fVar2 = coord->m_data[1];
  fVar3 = coord->m_data[2];
  fVar14 = -fVar1;
  if (-fVar1 <= fVar1) {
    fVar14 = fVar1;
  }
  fVar13 = -fVar2;
  if (-fVar2 <= fVar2) {
    fVar13 = fVar2;
  }
  bVar4 = 0x17 - (char)bits->m_data[0];
  fVar10 = (float)((uint)fVar1 & 0x7f800000);
  fVar15 = fVar10;
  if (((uint)fVar1 & 0x7fffff) != 0) {
    fVar15 = 1.1754944e-38;
  }
  fVar12 = -fVar3;
  if (-fVar3 <= fVar3) {
    fVar12 = fVar3;
  }
  if (fVar10 != 0.0) {
    fVar15 = fVar10;
  }
  bVar5 = 0x17 - (char)bits->m_data[1];
  fVar7 = (float)((uint)fVar2 & 0x7f800000);
  fVar10 = fVar7;
  if (((uint)fVar2 & 0x7fffff) != 0) {
    fVar10 = 1.1754944e-38;
  }
  if (fVar7 != 0.0) {
    fVar10 = fVar7;
  }
  fVar15 = (float)(((0x7fffffU >> (bVar4 & 0x1f)) << (bVar4 & 0x1f) | (uint)fVar15) ^ 0x7fffff) -
           fVar15;
  bVar4 = 0x17 - (char)bits->m_data[2];
  fVar11 = (float)((uint)fVar3 & 0x7f800000);
  fVar7 = 1.1754944e-38;
  if (((uint)fVar3 & 0x7fffff) == 0) {
    fVar7 = fVar11;
  }
  if (fVar11 != 0.0) {
    fVar7 = fVar11;
  }
  fVar10 = (float)(((0x7fffffU >> (bVar5 & 0x1f)) << (bVar5 & 0x1f) | (uint)fVar10) ^ 0x7fffff) -
           fVar10;
  fVar7 = (float)(((0x7fffffU >> (bVar4 & 0x1f)) << (bVar4 & 0x1f) | (uint)fVar7) ^ 0x7fffff) -
          fVar7;
  *numFaces = 0;
  if ((fVar14 - fVar15 <= fVar13 + fVar10) || (fVar14 - fVar15 <= fVar12 + fVar7)) {
    if ((fVar13 - fVar10 <= fVar14 + fVar15) || (fVar13 - fVar10 <= fVar12 + fVar7)) {
      if ((fVar12 - fVar7 <= fVar14 + fVar15) || (fVar12 - fVar7 <= fVar13 + fVar10)) {
        if (fVar15 < fVar14) {
          *numFaces = 1;
          *faces = CUBEFACE_NEGATIVE_X;
          *numFaces = 2;
          faces[1] = CUBEFACE_POSITIVE_X;
        }
        if (fVar10 < fVar13) {
          iVar8 = *numFaces;
          *numFaces = iVar8 + 1;
          faces[iVar8] = CUBEFACE_NEGATIVE_Y;
          *numFaces = iVar8 + 2;
          faces[iVar8 + 1] = CUBEFACE_POSITIVE_Y;
        }
        if (fVar12 <= fVar7) {
          return;
        }
        iVar8 = *numFaces;
        iVar6 = iVar8 + 1;
        *numFaces = iVar6;
        faces[iVar8] = CUBEFACE_NEGATIVE_Z;
        iVar8 = iVar8 + 2;
        CVar9 = CUBEFACE_POSITIVE_Z;
      }
      else {
        if (fVar7 <= fVar3) {
          *numFaces = 1;
          *faces = CUBEFACE_POSITIVE_Z;
        }
        if (fVar7 < fVar3) {
          return;
        }
        iVar6 = *numFaces;
        iVar8 = iVar6 + 1;
        CVar9 = CUBEFACE_NEGATIVE_Z;
      }
    }
    else {
      if (fVar10 <= fVar2) {
        *numFaces = 1;
        *faces = CUBEFACE_POSITIVE_Y;
      }
      if (fVar10 < fVar2) {
        return;
      }
      iVar6 = *numFaces;
      iVar8 = iVar6 + 1;
      CVar9 = CUBEFACE_NEGATIVE_Y;
    }
  }
  else {
    if (fVar15 <= fVar1) {
      *numFaces = 1;
      *faces = CUBEFACE_POSITIVE_X;
    }
    if (fVar15 < fVar1) {
      return;
    }
    iVar6 = *numFaces;
    iVar8 = iVar6 + 1;
    CVar9 = CUBEFACE_NEGATIVE_X;
  }
  *numFaces = iVar8;
  faces[iVar6] = CVar9;
  return;
}

Assistant:

void getPossibleCubeFaces (const Vec3& coord, const IVec3& bits, CubeFace* faces, int& numFaces)
{
	const float	x	= coord.x();
	const float	y	= coord.y();
	const float	z	= coord.z();
	const float ax	= de::abs(x);
	const float ay	= de::abs(y);
	const float az	= de::abs(z);
	const float ex	= computeFloatingPointError(x, bits.x());
	const float	ey	= computeFloatingPointError(y, bits.y());
	const float ez	= computeFloatingPointError(z, bits.z());

	numFaces = 0;

	if (ay+ey < ax-ex && az+ez < ax-ex)
	{
		if (x >= ex) faces[numFaces++] = CUBEFACE_POSITIVE_X;
		if (x <= ex) faces[numFaces++] = CUBEFACE_NEGATIVE_X;
	}
	else if (ax+ex < ay-ey && az+ez < ay-ey)
	{
		if (y >= ey) faces[numFaces++] = CUBEFACE_POSITIVE_Y;
		if (y <= ey) faces[numFaces++] = CUBEFACE_NEGATIVE_Y;
	}
	else if (ax+ex < az-ez && ay+ey < az-ez)
	{
		if (z >= ez) faces[numFaces++] = CUBEFACE_POSITIVE_Z;
		if (z <= ez) faces[numFaces++] = CUBEFACE_NEGATIVE_Z;
	}
	else
	{
		// One or more components are equal (or within error bounds). Allow all faces where major axis is not zero.
		if (ax > ex)
		{
			faces[numFaces++] = CUBEFACE_NEGATIVE_X;
			faces[numFaces++] = CUBEFACE_POSITIVE_X;
		}

		if (ay > ey)
		{
			faces[numFaces++] = CUBEFACE_NEGATIVE_Y;
			faces[numFaces++] = CUBEFACE_POSITIVE_Y;
		}

		if (az > ez)
		{
			faces[numFaces++] = CUBEFACE_NEGATIVE_Z;
			faces[numFaces++] = CUBEFACE_POSITIVE_Z;
		}
	}
}